

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2.cpp
# Opt level: O2

error<idx2::idx2_err_code> idx2::Init(idx2_file *Idx2,params *P)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 in_RCX;
  char *pcVar4;
  ulong uVar5;
  char cVar6;
  long lVar7;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar8;
  stref Dir;
  
  Dir.field_0._4_4_ = 0;
  Dir.field_0._0_4_ = (P->InDir).Size;
  Dir._8_8_ = in_RCX;
  SetDir((idx2 *)Idx2,(idx2_file *)(P->InDir).field_0.Ptr,Dir);
  SetDownsamplingFactor(Idx2,&P->DownsamplingFactor3);
  lVar7 = *in_FS_OFFSET;
  snprintf((cstr)(lVar7 + -0xc80),0x400,"%s",P->InputFile);
  eVar8 = ReadMetaFile(Idx2,(cstr)(lVar7 + -0xc80));
  pcVar4 = eVar8.Msg;
  if (eVar8.Code == NoError) {
    eVar8 = Finalize(Idx2,P);
    pcVar4 = eVar8.Msg;
    if (eVar8.Code == NoError) {
      if (((P->DecodeExtent).Dims & 0x7fffffffffffffff) == 0) {
        uVar1 = (Idx2->Dims3).field_0.field_0.X;
        uVar2 = (Idx2->Dims3).field_0.field_0.Y;
        uVar3 = (Idx2->Dims3).field_0.field_0.Z;
        (P->DecodeExtent).From = 0;
        (P->DecodeExtent).Dims =
             (ulong)(uVar3 & 0x1fffff) << 0x2a |
             ((ulong)uVar2 & 0x1fffff) << 0x15 | (ulong)uVar1 & 0x1fffff;
      }
      *(char **)(*in_FS_OFFSET + -0xe80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x1f;
      pcVar4 = "";
      uVar5 = 0;
      goto LAB_001053cf;
    }
    uVar5 = eVar8._8_8_ >> 8 & 0xffffff;
    cVar6 = (char)uVar5;
    if ('?' < cVar6) {
      uVar1 = 0x1c;
      goto LAB_001054a4;
    }
    uVar1 = eVar8._8_4_ & 0xff00ff | ((int)uVar5 + 1U & 0xff) << 8;
    lVar7 = (long)cVar6;
    *(undefined4 *)(*in_FS_OFFSET + -0xf7c + lVar7 * 4) = 0x1c;
  }
  else {
    uVar5 = eVar8._8_8_ >> 8 & 0xffffff;
    cVar6 = (char)uVar5;
    if ('?' < cVar6) {
      uVar1 = 0x1b;
LAB_001054a4:
      __assert_fail("false && \"stack too deep\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
                    ,uVar1,
                    "auto idx2::Init(idx2_file *, params &)::(anonymous class)::operator()() const")
      ;
    }
    uVar1 = eVar8._8_4_ & 0xff00ff | ((int)uVar5 + 1U & 0xff) << 8;
    lVar7 = (long)cVar6;
    *(undefined4 *)(*in_FS_OFFSET + -0xf7c + lVar7 * 4) = 0x1b;
  }
  uVar5 = (ulong)uVar1;
  *(char **)(*in_FS_OFFSET + -0xe78 + lVar7 * 8) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp";
LAB_001053cf:
  eVar8.Code = (char)uVar5;
  eVar8.StackIdx = (char)(uVar5 >> 8);
  eVar8.StrGened = (bool)(char)(uVar5 >> 0x10);
  eVar8._11_5_ = (int5)(uVar5 >> 0x18);
  eVar8.Msg = pcVar4;
  return eVar8;
}

Assistant:

error<idx2_err_code>
Init(idx2_file* Idx2, params& P)
{
  SetDir(Idx2, P.InDir);
  SetDownsamplingFactor(Idx2, P.DownsamplingFactor3);
  idx2_PropagateIfError(ReadMetaFile(Idx2, idx2_PrintScratch("%s", P.InputFile)));
  idx2_PropagateIfError(Finalize(Idx2, &P));
  if (Dims(P.DecodeExtent) == v3i(0)) // TODO: this could conflate with the user wanting to decode a single sample (very unlikely though)
    P.DecodeExtent = extent(Idx2->Dims3);
  return idx2_Error(idx2_err_code::NoError);
}